

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::ArrayPtr<unsigned_char_const>,kj::StringPtr&,kj::StringPtr>
                 (char *target,Delimited<kj::ArrayPtr<const_unsigned_char>_> *first,StringPtr *rest,
                 StringPtr *rest_1)

{
  char *pcVar1;
  StringPtr *first_00;
  StringPtr *rest_00;
  StringPtr *rest_local_1;
  StringPtr *rest_local;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *first_local;
  char *target_local;
  
  pcVar1 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo(first,target);
  first_00 = fwd<kj::StringPtr&>(rest);
  rest_00 = fwd<kj::StringPtr>(rest_1);
  pcVar1 = fill<kj::StringPtr,kj::StringPtr>(pcVar1,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}